

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

int fe_spch_to_frame(fe_t *fe,int len)

{
  float fVar1;
  short *psVar2;
  frame_t *pfVar3;
  window_t *pwVar4;
  ulong uVar5;
  uint uVar6;
  double *pdVar7;
  short sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  fVar1 = (float)fe->pre_emphasis_alpha;
  psVar2 = fe->spch;
  pfVar3 = fe->frame;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    *pfVar3 = (frame_t)((double)(int)*psVar2 - (double)(int)fe->pre_emphasis_prior * (double)fVar1);
    for (lVar10 = 1; lVar10 < len; lVar10 = lVar10 + 1) {
      pfVar3[lVar10] =
           (frame_t)((double)(int)psVar2[lVar10] - (double)(int)psVar2[lVar10 + -1] * (double)fVar1)
      ;
    }
    if (len < fe->frame_shift) {
      sVar8 = psVar2[(long)len + -1];
    }
    else {
      sVar8 = psVar2[(long)(int)fe->frame_shift + -1];
    }
    fe->pre_emphasis_prior = sVar8;
  }
  else {
    uVar5 = 0;
    uVar11 = 0;
    if (0 < len) {
      uVar11 = (ulong)(uint)len;
    }
    for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      pfVar3[uVar5] = (frame_t)(double)(int)psVar2[uVar5];
    }
  }
  uVar11 = 0;
  memset(pfVar3 + len,0,((long)fe->fft_size - (long)len) * 8);
  pwVar4 = fe->hamming_window;
  pfVar3 = fe->frame;
  uVar6 = (uint)fe->frame_size;
  if (fe->remove_dc != '\0') {
    uVar5 = 0;
    if (0 < fe->frame_size) {
      uVar5 = (ulong)uVar6;
    }
    dVar12 = 0.0;
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      dVar12 = dVar12 + (double)pfVar3[uVar9];
    }
    for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
      pfVar3[uVar9] = (frame_t)((double)pfVar3[uVar9] - dVar12 / (double)(int)uVar6);
    }
  }
  uVar5 = (long)(int)uVar6 / 2 & 0xffffffff;
  if ((int)((long)(int)uVar6 / 2) < 1) {
    uVar5 = uVar11;
  }
  pdVar7 = (double *)(pfVar3 + (int)uVar6);
  for (; pdVar7 = pdVar7 + -1, uVar5 != uVar11; uVar11 = uVar11 + 1) {
    pfVar3[uVar11] = (frame_t)((double)pfVar3[uVar11] * (double)pwVar4[uVar11]);
    *pdVar7 = *pdVar7 * (double)pwVar4[uVar11];
  }
  return len;
}

Assistant:

static int
fe_spch_to_frame(fe_t * fe, int len)
{
    /* Copy to the frame buffer. */
    if (fe->pre_emphasis_alpha != 0.0) {
        fe_pre_emphasis_int16(fe->spch, fe->frame, len,
                              fe->pre_emphasis_alpha,
                              fe->pre_emphasis_prior);
        if (len >= fe->frame_shift)
            fe->pre_emphasis_prior = fe->spch[fe->frame_shift - 1];
        else
            fe->pre_emphasis_prior = fe->spch[len - 1];
    }
    else
        fe_copy_to_frame_int16(fe->spch, fe->frame, len);

    /* Zero pad up to FFT size. */
    memset(fe->frame + len, 0, (fe->fft_size - len) * sizeof(*fe->frame));

    /* Window. */
    fe_hamming_window(fe->frame, fe->hamming_window, fe->frame_size,
                      fe->remove_dc);

    return len;
}